

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iRpn.cpp
# Opt level: O2

char __thiscall Imaginer::Utils::iRpn::getFun(iRpn *this,string *funname)

{
  bool bVar1;
  long lVar2;
  undefined1 *__rhs;
  
  lVar2 = -0x14;
  __rhs = _sysfunS_abi_cxx11_;
  do {
    if (lVar2 == 0) {
      return -0x6c;
    }
    bVar1 = std::operator!=(funname,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__rhs);
    lVar2 = lVar2 + 1;
    __rhs = (undefined1 *)((long)__rhs + 0x20);
  } while (bVar1);
  return (char)lVar2 + -0x6d;
}

Assistant:

char   iRpn::getFun(std::string funname)
{
    char index = -1;
    while(++index < FUNNUM && funname != _sysfunS[index]);
    //    std::cout << _sysfunS[index] << std::endl;
    return (index - 128);
}